

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

pair<unsigned_long,_bool>
detail::try_get_range_size<std::__cxx11::string>(span<const_std::byte> buffer)

{
  size_t sVar1;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  byte *in_RDI;
  pair<unsigned_long,_bool> pVar4;
  span<const_std::byte> local_20;
  
  local_20.begin_ = in_RDI;
  sVar1 = span<const_std::byte>::size(&local_20);
  if (7 < sVar1) {
    uVar3 = *(undefined8 *)local_20.begin_;
    local_20.begin_ = local_20.begin_ + 8;
    uVar2 = span<const_std::byte>::size(&local_20);
    if ((ulong)uVar3 <= (ulong)uVar2) {
      local_20.begin_ = local_20.begin_ + (uVar3 - (long)in_RDI);
      uVar3 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      goto LAB_001048c9;
    }
  }
  local_20.begin_ = (byte *)0x0;
  uVar3 = 0;
LAB_001048c9:
  pVar4._8_8_ = uVar3;
  pVar4.first = (unsigned_long)local_20.begin_;
  return pVar4;
}

Assistant:

std::pair<size_t, bool> try_get_range_size(span<std::byte const> buffer) noexcept {
        auto const data_begin = buffer.begin();

        size_t count;
        if (buffer.size() < sizeof(count)) return { {}, false };
        deserialize(count, buffer);
        
        using value_type = typename range_traits<T>::value_type;
        if constexpr (serialization_category_v<value_type> == serialization_category::trivial) {
            auto const elements_size = count * sizeof(value_type);
            if (buffer.size() < elements_size) return { {}, false };
            buffer.begin() += elements_size;
        }
        else {
            for (size_t i = 0; i < count; ++i) {
                auto const [size, success] = try_get_deserialized_size<value_type>(buffer);
                if (!success) return { {}, false };
                buffer.begin() += size;
            }
        }
        return { buffer.begin() - data_begin, true };
    }